

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls_record.cc
# Opt level: O2

bool bssl::dtls_seal_record
               (SSL *ssl,DTLSRecordNumber *out_number,uint8_t *out,size_t *out_len,size_t max_out,
               uint8_t type,uint8_t *in,size_t in_len,uint16_t epoch)

{
  RecordNumberEncrypter *pRVar1;
  Span<const_unsigned_char> header;
  SSL *pSVar2;
  ulong uVar3;
  bool bVar4;
  uint16_t record_version;
  ushort uVar5;
  int iVar6;
  size_t sVar7;
  DTLSWriteEpoch *pDVar8;
  uchar *puVar9;
  uint64_t seqnum;
  DTLSRecordNumber DVar10;
  long lVar11;
  uintptr_t b_u;
  uint8_t *extra_in;
  int line;
  ulong uVar12;
  uint8_t *out_prefix;
  Span<const_unsigned_char> in_00;
  uint8_t type_local;
  uint8_t mask [2];
  size_t ciphertext_len;
  DTLSRecordNumber local_88;
  SSL *local_80;
  uchar *local_78;
  ulong local_70;
  uchar *local_68;
  SSLAEADContext *local_60;
  DTLSRecordNumber *local_58;
  size_t *local_50;
  DTLSRecordNumber record_number;
  
  type_local = type;
  local_80 = ssl;
  local_58 = out_number;
  local_50 = out_len;
  sVar7 = dtls_seal_prefix_len(ssl,epoch);
  pSVar2 = local_80;
  if ((in < out + max_out && out < in + in_len) && (max_out < sVar7 || out + sVar7 != in)) {
    iVar6 = 0xbd;
    line = 0x1e6;
  }
  else {
    pDVar8 = dtls_get_write_epoch(local_80,epoch);
    if (pDVar8 == (DTLSWriteEpoch *)0x0) {
      iVar6 = 0x44;
      line = 0x1ed;
    }
    else {
      puVar9 = (uchar *)dtls_record_header_write_len(pSVar2,epoch);
      record_number.combined_ = (pDVar8->next_record).combined_;
      if ((~record_number.combined_ & 0xffffffffffff) == 0) {
        iVar6 = 0x45;
        line = 0x1f6;
      }
      else {
        local_88.combined_ = record_number.combined_;
        local_68 = puVar9;
        bVar4 = use_dtls13_record_header(pSVar2,epoch);
        local_70 = (ulong)bVar4;
        extra_in = &type_local;
        if (!bVar4) {
          extra_in = (uint8_t *)0x0;
        }
        bVar4 = SSLAEADContext::CiphertextLen
                          ((pDVar8->aead)._M_t.
                           super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t
                           .super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl,
                           &ciphertext_len,in_len,local_70);
        if (bVar4) {
          local_78 = local_68;
          if (local_68 + CONCAT62(ciphertext_len._2_6_,(ushort)ciphertext_len) <= max_out) {
            record_version = dtls_record_version(pSVar2);
            if (local_70 == 0) {
              *out = type;
              uVar5 = record_version << 8 | record_version >> 8;
              *(uint64_t *)(out + 3) =
                   local_88.combined_ >> 0x38 | (local_88.combined_ & 0xff000000000000) >> 0x28 |
                   (local_88.combined_ & 0xff0000000000) >> 0x18 |
                   (local_88.combined_ & 0xff00000000) >> 8 | (local_88.combined_ & 0xff000000) << 8
                   | (local_88.combined_ & 0xff0000) << 0x18 | (local_88.combined_ & 0xff00) << 0x28
                   | local_88.combined_ << 0x38;
              lVar11 = 0xb;
            }
            else {
              *out = (byte)epoch & 3 | 0x2c;
              uVar5 = (ushort)(pDVar8->next_record).combined_;
              uVar5 = uVar5 << 8 | uVar5 >> 8;
              lVar11 = 3;
            }
            *(ushort *)(out + lVar11) = (ushort)ciphertext_len << 8 | (ushort)ciphertext_len >> 8;
            *(ushort *)(out + 1) = uVar5;
            local_60 = (pDVar8->aead)._M_t.
                       super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl;
            out_prefix = local_68 + (long)out;
            seqnum = dtls_aead_sequence(local_80,local_88);
            uVar3 = local_70;
            uVar12 = (ulong)record_version;
            header.size_ = (size_t)local_78;
            header.data_ = out;
            bVar4 = SSLAEADContext::SealScatter
                              (local_60,out_prefix,out + sVar7,out + sVar7 + in_len,type,
                               record_version,seqnum,header,in,in_len,extra_in,local_70);
            pSVar2 = local_80;
            if (!bVar4) {
              return false;
            }
            if (uVar3 != 0) {
              pRVar1 = (pDVar8->rn_encrypter)._M_t.
                       super___uniq_ptr_impl<bssl::RecordNumberEncrypter,_bssl::internal::Deleter>.
                       _M_t.
                       super__Tuple_impl<0UL,_bssl::RecordNumberEncrypter_*,_bssl::internal::Deleter>
                       .super__Head_base<0UL,_bssl::RecordNumberEncrypter_*,_false>._M_head_impl;
              iVar6 = (*pRVar1->_vptr_RecordNumberEncrypter[4])
                                (pRVar1,mask,2,out_prefix,
                                 CONCAT62(ciphertext_len._2_6_,(ushort)ciphertext_len));
              if ((char)iVar6 == '\0') {
                return false;
              }
              out[1] = out[1] ^ mask[0];
              out[2] = out[2] ^ mask[1];
            }
            local_58->combined_ = local_88.combined_;
            DVar10 = DTLSRecordNumber::Next(&record_number);
            (pDVar8->next_record).combined_ = DVar10.combined_;
            *local_50 = (size_t)(local_78 + CONCAT62(ciphertext_len._2_6_,(ushort)ciphertext_len));
            in_00.size_ = uVar12;
            in_00.data_ = local_78;
            ssl_do_msg_callback((bssl *)pSVar2,(SSL *)0x1,0x100,(int)out,in_00);
            return true;
          }
          iVar6 = 0x79;
          line = 0x209;
        }
        else {
          iVar6 = 200;
          line = 0x205;
        }
      }
    }
  }
  ERR_put_error(0x10,0,iVar6,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/dtls_record.cc"
                ,line);
  return false;
}

Assistant:

bool dtls_seal_record(SSL *ssl, DTLSRecordNumber *out_number, uint8_t *out,
                      size_t *out_len, size_t max_out, uint8_t type,
                      const uint8_t *in, size_t in_len, uint16_t epoch) {
  const size_t prefix = dtls_seal_prefix_len(ssl, epoch);
  if (buffers_alias(in, in_len, out, max_out) &&
      (max_out < prefix || out + prefix != in)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_OUTPUT_ALIASES_INPUT);
    return false;
  }

  // Determine the parameters for the current epoch.
  DTLSWriteEpoch *write_epoch = dtls_get_write_epoch(ssl, epoch);
  if (write_epoch == nullptr) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }

  const size_t record_header_len = dtls_record_header_write_len(ssl, epoch);

  // Ensure the sequence number update does not overflow.
  DTLSRecordNumber record_number = write_epoch->next_record;
  if (!record_number.HasNext()) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_OVERFLOW);
    return false;
  }

  bool dtls13_header = use_dtls13_record_header(ssl, epoch);
  uint8_t *extra_in = NULL;
  size_t extra_in_len = 0;
  if (dtls13_header) {
    extra_in = &type;
    extra_in_len = 1;
  }

  size_t ciphertext_len;
  if (!write_epoch->aead->CiphertextLen(&ciphertext_len, in_len,
                                        extra_in_len)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_RECORD_TOO_LARGE);
    return false;
  }
  if (max_out < record_header_len + ciphertext_len) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_BUFFER_TOO_SMALL);
    return false;
  }

  uint16_t record_version = dtls_record_version(ssl);
  if (dtls13_header) {
    // The first byte of the DTLS 1.3 record header has the following format:
    // 0 1 2 3 4 5 6 7
    // +-+-+-+-+-+-+-+-+
    // |0|0|1|C|S|L|E E|
    // +-+-+-+-+-+-+-+-+
    //
    // We set C=0 (no Connection ID), S=1 (16-bit sequence number), L=1 (length
    // is present), which is a mask of 0x2c. The E E bits are the low-order two
    // bits of the epoch.
    //
    // +-+-+-+-+-+-+-+-+
    // |0|0|1|0|1|1|E E|
    // +-+-+-+-+-+-+-+-+
    out[0] = 0x2c | (epoch & 0x3);
    // We always use a two-byte sequence number. A one-byte sequence number
    // would require coordinating with the application on ACK feedback to know
    // that the peer is not too far behind.
    CRYPTO_store_u16_be(out + 1, write_epoch->next_record.sequence());
    // TODO(crbug.com/42290594): When we know the record is last in the packet,
    // omit the length.
    CRYPTO_store_u16_be(out + 3, ciphertext_len);
  } else {
    out[0] = type;
    CRYPTO_store_u16_be(out + 1, record_version);
    CRYPTO_store_u64_be(out + 3, record_number.combined());
    CRYPTO_store_u16_be(out + 11, ciphertext_len);
  }
  Span<const uint8_t> header(out, record_header_len);

  if (!write_epoch->aead->SealScatter(
          out + record_header_len, out + prefix, out + prefix + in_len, type,
          record_version, dtls_aead_sequence(ssl, record_number), header, in,
          in_len, extra_in, extra_in_len)) {
    return false;
  }

  // Perform record number encryption (RFC 9147 section 4.2.3).
  if (dtls13_header) {
    // Record number encryption uses bytes from the ciphertext as a sample to
    // generate the mask used for encryption. For simplicity, pass in the whole
    // ciphertext as the sample - GenerateRecordNumberMask will read only what
    // it needs (and error if |sample| is too short).
    Span<const uint8_t> sample(out + record_header_len, ciphertext_len);
    uint8_t mask[2];
    if (!write_epoch->rn_encrypter->GenerateMask(mask, sample)) {
      return false;
    }
    out[1] ^= mask[0];
    out[2] ^= mask[1];
  }

  *out_number = record_number;
  write_epoch->next_record = record_number.Next();
  *out_len = record_header_len + ciphertext_len;
  ssl_do_msg_callback(ssl, 1 /* write */, SSL3_RT_HEADER, header);
  return true;
}